

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_lua.cpp
# Opt level: O0

string * __thiscall
flatbuffers::anon_unknown_25::LuaBfbsGenerator::GenerateStructBuilderArgs
          (string *__return_storage_ptr__,LuaBfbsGenerator *this,Object *object,string *prefix)

{
  string *object_00;
  anon_class_24_3_02b98a2d local_68;
  function<void_(const_reflection::Field_*)> local_50;
  undefined1 local_29;
  string *local_28;
  string *prefix_local;
  Object *object_local;
  LuaBfbsGenerator *this_local;
  string *signature;
  
  local_29 = 0;
  local_28 = prefix;
  prefix_local = (string *)object;
  object_local = (Object *)this;
  this_local = (LuaBfbsGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  object_00 = prefix_local;
  local_68.this = this;
  local_68.signature = __return_storage_ptr__;
  local_68.prefix = prefix;
  std::function<void(reflection::Field_const*)>::
  function<flatbuffers::(anonymous_namespace)::LuaBfbsGenerator::GenerateStructBuilderArgs(reflection::Object_const*,std::__cxx11::string)const::_lambda(reflection::Field_const*)_1_,void>
            ((function<void(reflection::Field_const*)> *)&local_50,&local_68);
  BaseBfbsGenerator::ForAllFields
            (&this->super_BaseBfbsGenerator,(Object *)object_00,false,&local_50);
  std::function<void_(const_reflection::Field_*)>::~function(&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateStructBuilderArgs(const r::Object *object,
                                        std::string prefix = "") const {
    std::string signature;
    ForAllFields(object, /*reverse=*/false, [&](const r::Field *field) {
      if (IsStructOrTable(field->type()->base_type())) {
        const r::Object *field_object = GetObject(field->type());
        signature += GenerateStructBuilderArgs(
            field_object, prefix + namer_.Variable(*field) + "_");
      } else {
        signature += ", " + prefix + namer_.Variable(*field);
      }
    });
    return signature;
  }